

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

void N_VConst_ManyVector(sunrealtype c,N_Vector z)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)z->content;
  if (0 < *plVar1) {
    lVar2 = 0;
    do {
      N_VConst(c,*(undefined8 *)(plVar1[2] + lVar2 * 8));
      lVar2 = lVar2 + 1;
      plVar1 = (long *)z->content;
    } while (lVar2 < *plVar1);
  }
  return;
}

Assistant:

void MVAPPEND(N_VConst)(sunrealtype c, N_Vector z)
{
  SUNFunctionBegin(z->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(z); i++)
  {
    N_VConst(c, MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}